

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O2

void flyd::Signal::SignalHandler(int signo,siginfo_t *siginfo,void *ucontext)

{
  int iVar1;
  __pid_t v;
  mapped_type *pp_Var2;
  self *psVar3;
  LogStream *pLVar4;
  int *piVar5;
  byte bVar6;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  int signo_local;
  int status;
  undefined1 local_1078 [12];
  undefined1 local_1068 [12];
  undefined1 local_1058 [12];
  undefined1 local_1048 [12];
  undefined1 local_1038 [12];
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  Logger local_1008;
  
  signo_local = signo;
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_1018,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1018._0_8_;
    file.size_ = local_1018._8_4_;
    muduo::Logger::Logger(&local_1008,file,0x1b);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_12bca);
    muduo::Logger::~Logger(&local_1008);
  }
  pp_Var2 = std::__detail::
            _Map_base<int,_std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&signals_,&signo_local);
  if (*pp_Var2 == (mapped_type)0x0) {
    muduo::Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_1028,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
              );
    file_00._12_4_ = 0;
    file_00.data_ = (char *)local_1028._0_8_;
    file_00.size_ = local_1028._8_4_;
    muduo::Logger::Logger(&local_1008,file_00,0x1f,WARN);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_12be0);
    muduo::Logger::~Logger(&local_1008);
  }
  if ((siginfo == (siginfo_t *)0x0) || ((siginfo->_sifields)._pad[0] == 0)) {
    if (2 < muduo::g_logLevel) goto LAB_001160ad;
    muduo::Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_1048,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
              );
    file_02._12_4_ = 0;
    file_02.data_ = (char *)local_1048._0_8_;
    file_02.size_ = local_1048._8_4_;
    muduo::Logger::Logger(&local_1008,file_02,0x36);
    psVar3 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,"signal is ");
    muduo::LogStream::operator<<(psVar3,signo_local);
  }
  else {
    if (2 < muduo::g_logLevel) goto LAB_001160ad;
    muduo::Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_1038,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
              );
    file_01._12_4_ = 0;
    file_01.data_ = (char *)local_1038._0_8_;
    file_01.size_ = local_1038._8_4_;
    muduo::Logger::Logger(&local_1008,file_01,0x32);
    psVar3 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,"signal is ");
    pLVar4 = muduo::LogStream::operator<<(psVar3,signo_local);
    psVar3 = muduo::LogStream::operator<<(pLVar4," ,si_pid is ");
    muduo::LogStream::operator<<(psVar3,(siginfo->_sifields)._pad[0]);
  }
  muduo::Logger::~Logger(&local_1008);
LAB_001160ad:
  if (signo_local == 0x11) {
    bVar6 = 0;
LAB_001160ce:
    do {
      v = waitpid(-1,&status,1);
      if (v != -1) {
        if (v == 0) {
          return;
        }
        bVar6 = 1;
        if ((status & 0x7fU) == 0) {
          if (2 < muduo::g_logLevel) goto LAB_001160ce;
          muduo::Logger::SourceFile::SourceFile<103>
                    ((SourceFile *)local_1078,
                     (char (*) [103])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
                    );
          file_04._12_4_ = 0;
          file_04.data_ = (char *)local_1078._0_8_;
          file_04.size_ = local_1078._8_4_;
          muduo::Logger::Logger(&local_1008,file_04,0x78);
          psVar3 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,"pid = ");
          pLVar4 = muduo::LogStream::operator<<(psVar3,v);
          psVar3 = muduo::LogStream::operator<<(pLVar4,"exited with code");
          muduo::LogStream::operator<<(psVar3,(uint)status >> 8 & 0xff);
        }
        else {
          if (2 < muduo::g_logLevel) goto LAB_001160ce;
          muduo::Logger::SourceFile::SourceFile<103>
                    ((SourceFile *)local_1068,
                     (char (*) [103])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
                    );
          file_03._12_4_ = 0;
          file_03.data_ = (char *)local_1068._0_8_;
          file_03.size_ = local_1068._8_4_;
          muduo::Logger::Logger(&local_1008,file_03,0x74);
          psVar3 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,"pid = ");
          pLVar4 = muduo::LogStream::operator<<(psVar3,v);
          psVar3 = muduo::LogStream::operator<<(pLVar4," exited on signal ");
          muduo::LogStream::operator<<(psVar3,status & 0x7f);
        }
        muduo::Logger::~Logger(&local_1008);
        goto LAB_001160ce;
      }
      piVar5 = __errno_location();
      iVar1 = *piVar5;
    } while (iVar1 == 4);
    if (!(bool)(bVar6 & iVar1 == 10)) {
      if (iVar1 == 10) {
        muduo::Logger::SourceFile::SourceFile<103>
                  ((SourceFile *)local_1058,
                   (char (*) [103])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
                  );
        file_05._12_4_ = 0;
        file_05.data_ = (char *)local_1058._0_8_;
        file_05.size_ = local_1058._8_4_;
        muduo::Logger::Logger(&local_1008,file_05,0x69,ERROR);
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,"waitpid() failed!");
      }
      else {
        muduo::Logger::SourceFile::SourceFile<103>
                  ((SourceFile *)local_1058,
                   (char (*) [103])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
                  );
        file_06._12_4_ = 0;
        file_06.data_ = (char *)local_1058._0_8_;
        file_06.size_ = local_1058._8_4_;
        muduo::Logger::Logger(&local_1008,file_06,0x6c,ERROR);
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,"waitpid() failed!");
      }
      muduo::Logger::~Logger(&local_1008);
    }
  }
  return;
}

Assistant:

void flyd::Signal::SignalHandler(int signo, siginfo_t *siginfo, void *ucontext)
{
    LOG_INFO << "来信号了";
    char            *action; //一个字符串，用于记录一个动作字符串以往日志文件中写
    if(signals_[signo] == NULL)
    {
        LOG_WARN << "该信号未注册";
    }

    action = (char* )" ";//信号的动作

    if(flyd_process == FLYD_MASTER_PROCESS)//MASTER进程，管理进程，信号处理比较多
    {

    }
    else if(flyd_process == FLYD_WORK_PROCESS)//WORK进程，具体干活的进程，处理信号比较少
    {

    }
    else{//未定义的其他进程，暂时什么都不干

    }

    if(siginfo && siginfo->si_pid)
    {
        LOG_INFO << "signal is " << signo << " ,si_pid is " << siginfo->si_pid;
    }
    else
    {
        LOG_INFO << "signal is " << signo ;
    }


    //子进程状态有变化，通常是意外退出【既然官方是在这里处理，我们也学习官方在这里处理】
    if (signo == SIGCHLD)
    {
        flyd_process_get_status(); //获取子进程的结束状态
    } //end if


}